

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_echo_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  double dVar3;
  exception *e;
  undefined1 local_148 [8];
  echo_tester tester;
  epoll tep;
  string local_78 [32];
  ipv4_address local_58;
  allocator local_51;
  string local_50 [36];
  ipv4_endpoint local_2c;
  ipv4_endpoint endpoint;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,&local_51);
    dVar3 = std::__cxx11::stod((string *)local_50,(size_t *)0x0);
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,pcVar1,
               (allocator *)
               ((long)&tep.timer_.queue._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    ipv4_address::ipv4_address(&local_58,(string *)local_78);
    ipv4_endpoint::ipv4_endpoint(&local_2c,(uint16_t)(int)dVar3,local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tep.timer_.queue._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    poVar2 = operator<<((ostream *)&std::cout,&local_2c);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sysapi::epoll::epoll((epoll *)&tester.number_of_permanent_connections);
    echo_tester::echo_tester
              ((echo_tester *)local_148,(epoll *)&tester.number_of_permanent_connections,local_2c);
    sysapi::epoll::run((epoll *)&tester.number_of_permanent_connections);
    echo_tester::~echo_tester((echo_tester *)local_148);
    sysapi::epoll::~epoll((epoll *)&tester.number_of_permanent_connections);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," hostname port\n");
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    try
    {
        if (argc != 3)
        {
            std::cerr << "usage: " << argv[0] << " hostname port\n";
            return 0;
        }

        ipv4_endpoint endpoint(std::stod(argv[2]), ipv4_address(argv[1]));
        std::cout << endpoint << std::endl;
        sysapi::epoll tep;
        echo_tester tester{tep, endpoint};
        tep.run();
    }
    catch (std::exception const& e)
    {
        std::cerr << "error: " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    catch (...)
    {
        std::cerr << "unknown exception in main" << std::endl;
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}